

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<duckdb::date_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<duckdb::date_t,_double> *source_00;
  ArgMinMaxState<duckdb::date_t,_double> *in_RCX;
  idx_t i;
  ArgMinMaxState<duckdb::date_t,_double> **tdata;
  ArgMinMaxState<duckdb::date_t,_double> **sdata;
  ArgMinMaxState<duckdb::date_t,_double> *target_00;
  
  FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::date_t,double>const*>((Vector *)0x8d8ea2);
  source_00 = (ArgMinMaxState<duckdb::date_t,_double> *)
              FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::date_t,double>*>
                        ((Vector *)0x8d8eb1);
  for (target_00 = (ArgMinMaxState<duckdb::date_t,_double> *)0x0; target_00 < in_RCX;
      target_00 = (ArgMinMaxState<duckdb::date_t,_double> *)
                  &(target_00->super_ArgMinMaxStateBase).arg_null) {
    ArgMinMaxBase<duckdb::GreaterThan,true>::
    Combine<duckdb::ArgMinMaxState<duckdb::date_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
              (source_00,target_00,(AggregateInputData *)0x8d8eed);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}